

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O3

void __thiscall TUPU::TImage::TImage(TImage *this,TImage *img)

{
  void *__src;
  size_t __size;
  void *__dest;
  
  this->_vptr_TImage = (_func_int **)&PTR__TImage_00502d28;
  (this->m_url)._M_dataplus._M_p = (pointer)&(this->m_url).field_2;
  (this->m_url)._M_string_length = 0;
  (this->m_url).field_2._M_local_buf[0] = '\0';
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
  (this->m_tag)._M_string_length = 0;
  (this->m_tag).field_2._M_local_buf[0] = '\0';
  (this->m_sequenceId)._M_dataplus._M_p = (pointer)&(this->m_sequenceId).field_2;
  (this->m_sequenceId)._M_string_length = 0;
  (this->m_sequenceId).field_2._M_local_buf[0] = '\0';
  this->m_buffer = (void *)0x0;
  this->m_len = 0;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_tag);
  std::__cxx11::string::_M_assign((string *)&this->m_sequenceId);
  __src = img->m_buffer;
  if (__src == (void *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->m_url);
    std::__cxx11::string::_M_assign((string *)&this->m_path);
  }
  else {
    __size = img->m_len;
    this->m_len = __size;
    std::__cxx11::string::_M_assign((string *)&this->m_filename);
    __dest = malloc(__size);
    this->m_buffer = __dest;
    memcpy(__dest,__src,__size);
    (this->m_url)._M_string_length = 0;
    *(this->m_url)._M_dataplus._M_p = '\0';
    (this->m_path)._M_string_length = 0;
    *(this->m_path)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

TImage::TImage(const TImage & img)
    : m_buffer(NULL)
    , m_len(0)
{
    m_tag = img.m_tag;
    m_sequenceId = img.m_sequenceId;
    if (img.m_buffer) {
        setBinary(img.m_buffer, img.m_len, img.m_filename);
    } else {
        m_url = img.m_url;
        m_path = img.m_path;
    }
}